

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_sndio.c
# Opt level: O2

void * sndio_mainloop(void *arg)

{
  pthread_mutex_t *__mutex;
  char cVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  pollfd *__fds;
  long lVar5;
  size_t sVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  int16_t *dst;
  short *psVar14;
  float fVar15;
  undefined8 uStack_80;
  ulong local_70;
  ulong local_68;
  ulong local_40;
  
  iVar3 = (*cubeb_sio_nfds)(*(sio_hdl **)((long)arg + 0x40));
  __fds = (pollfd *)calloc((long)iVar3,8);
  if (__fds != (pollfd *)0x0) {
    (**(code **)((long)arg + 0x98))(arg,*(undefined8 *)((long)arg + 8),0);
    __mutex = (pthread_mutex_t *)((long)arg + 0x18);
    pthread_mutex_lock(__mutex);
    iVar3 = (*cubeb_sio_start)(*(sio_hdl **)((long)arg + 0x40));
    if (iVar3 == 0) {
      pthread_mutex_unlock(__mutex);
    }
    else {
      iVar3 = *(int *)((long)arg + 0x68);
      if ((*(uint *)((long)arg + 0x48) & 1) == 0) {
        iVar13 = 0;
        local_68 = 0;
        uVar12 = 0;
        local_70 = (ulong)(uint)(iVar3 * *(int *)((long)arg + 0x6c));
      }
      else {
        local_68 = (ulong)(uint)(*(int *)((long)arg + 0x70) * iVar3);
        iVar13 = *(int *)((long)arg + 0x7c);
        if ((*(uint *)((long)arg + 0x48) & 2) == 0) {
          uVar12 = 0;
          local_70 = 0;
        }
        else {
          memset(*(void **)((long)arg + 0x58),0,(ulong)(uint)(iVar3 * *(int *)((long)arg + 0x6c)));
          uVar12 = (ulong)(uint)(*(int *)((long)arg + 0x6c) * *(int *)((long)arg + 0x68));
          local_70 = uVar12;
        }
      }
      bVar2 = false;
      local_40 = local_68;
LAB_00121aa4:
      if (*(int *)((long)arg + 0x4c) == 0) {
        uStack_80 = 1;
      }
      else {
        uVar4 = *(uint *)((long)arg + 0x48) & 2;
        uVar7 = *(uint *)((long)arg + 0x48) & 1;
        if ((uVar7 != 0) && (local_68 != local_40)) {
          uVar7 = 1;
LAB_00121c8e:
          bVar10 = (iVar13 == 0 && uVar4 != 0) && (uVar12 <= local_70 && local_70 - uVar12 != 0);
          cVar1 = bVar10 + '\x04';
          if (local_40 < local_68 || local_40 - local_68 == 0) {
            cVar1 = bVar10;
          }
          if (uVar7 == 0) {
            cVar1 = bVar10;
          }
          uVar4 = (*cubeb_sio_pollfd)(*(sio_hdl **)((long)arg + 0x40),(pollfd *)__fds,(int)cVar1);
          if (0 < (int)uVar4) goto code_r0x00121cdf;
          goto LAB_00121d23;
        }
        if ((uVar4 != 0) && (uVar12 != local_70)) goto LAB_00121c8e;
        if (!bVar2) {
          if ((uVar4 != 0) && (*(int *)((long)arg + 0x50) != 0)) {
            lVar11 = *(long *)((long)arg + 0x58);
            for (uVar8 = (ulong)(uint)(*(int *)((long)arg + 0x74) * *(int *)((long)arg + 0x68));
                0 < (long)uVar8; uVar8 = uVar8 - 1) {
              *(float *)(lVar11 + -4 + uVar8 * 4) =
                   (float)(int)*(short *)(lVar11 + -2 + uVar8 * 2) * 3.0517578e-05;
            }
          }
          pthread_mutex_unlock(__mutex);
          uVar8 = (**(code **)((long)arg + 0x90))
                            (arg,*(undefined8 *)((long)arg + 8),*(undefined8 *)((long)arg + 0x58),
                             *(undefined8 *)((long)arg + 0x60),*(undefined4 *)((long)arg + 0x68));
          pthread_mutex_lock(__mutex);
          if (-1 < (long)uVar8) {
            *(long *)((long)arg + 0x88) = *(long *)((long)arg + 0x88) + uVar8;
            uVar4 = *(uint *)((long)arg + 0x48);
            uVar7 = uVar4 & 1;
            if (uVar8 < *(uint *)((long)arg + 0x68)) {
              if ((uVar7 == 0) || (uVar8 == 0)) goto LAB_00121dd6;
              local_40 = *(uint *)((long)arg + 0x70) * uVar8;
              uVar7 = 1;
              bVar2 = true;
            }
            else {
              bVar2 = false;
            }
            if (uVar7 == 0) {
              uVar7 = 0;
            }
            else {
              lVar11 = uVar8 * *(uint *)((long)arg + 0x78);
              psVar14 = *(short **)((long)arg + 0x60);
              fVar15 = *(float *)((long)arg + 0xa0) * 32768.0;
              if (*(int *)((long)arg + 0x50) == 0) {
                for (; 0 < lVar11; lVar11 = lVar11 + -1) {
                  *psVar14 = (short)((uint)((int)*psVar14 * (int)fVar15) >> 0xf);
                  psVar14 = psVar14 + 1;
                }
              }
              else {
                lVar9 = 0;
                for (; 0 < lVar11; lVar11 = lVar11 + -1) {
                  lVar5 = lrintf(*(float *)(psVar14 + lVar9) * fVar15);
                  if (0x7ffe < (int)lVar5) {
                    lVar5 = 0x7fff;
                  }
                  if ((int)lVar5 < -0x7fff) {
                    lVar5 = 0xffff8000;
                  }
                  *(short *)((long)psVar14 + lVar9) = (short)lVar5;
                  lVar9 = lVar9 + 2;
                }
                uVar4 = *(uint *)((long)arg + 0x48);
                uVar7 = uVar4 & 1;
              }
            }
            iVar13 = iVar13 - (uint)(0 < iVar13);
            uVar4 = uVar4 & 2;
            if (uVar4 != 0) {
              uVar12 = 0;
            }
            if (uVar7 != 0) {
              local_68 = 0;
            }
            goto LAB_00121c8e;
          }
          goto LAB_00121dce;
        }
LAB_00121dd6:
        uStack_80 = 2;
      }
LAB_00121dd8:
      (*cubeb_sio_stop)(*(sio_hdl **)((long)arg + 0x40));
      *(undefined8 *)((long)arg + 0x80) = *(undefined8 *)((long)arg + 0x88);
      pthread_mutex_unlock(__mutex);
      (**(code **)((long)arg + 0x98))(arg,*(undefined8 *)((long)arg + 8),uStack_80);
    }
    free(__fds);
  }
  return (void *)0x0;
code_r0x00121cdf:
  pthread_mutex_unlock(__mutex);
  iVar3 = poll(__fds,(ulong)uVar4,-1);
  pthread_mutex_lock(__mutex);
  if (iVar3 < 0) goto LAB_00121aa4;
LAB_00121d23:
  uVar4 = (*cubeb_sio_revents)(*(sio_hdl **)((long)arg + 0x40),(pollfd *)__fds);
  if ((uVar4 & 0x10) != 0) {
LAB_00121dce:
    uStack_80 = 3;
    goto LAB_00121dd8;
  }
  if ((uVar4 & 4) != 0) {
    sVar6 = (*cubeb_sio_write)(*(sio_hdl **)((long)arg + 0x40),
                               (void *)(*(long *)((long)arg + 0x60) + local_68),local_40 - local_68)
    ;
    if (((int)sVar6 == 0) && (iVar3 = (*cubeb_sio_eof)(*(sio_hdl **)((long)arg + 0x40)), iVar3 != 0)
       ) goto LAB_00121dce;
    local_68 = local_68 + (long)(int)sVar6;
  }
  if ((uVar4 & 1) != 0) {
    sVar6 = (*cubeb_sio_read)(*(sio_hdl **)((long)arg + 0x40),
                              (void *)(*(long *)((long)arg + 0x58) + uVar12),local_70 - uVar12);
    if (((int)sVar6 == 0) && (iVar3 = (*cubeb_sio_eof)(*(sio_hdl **)((long)arg + 0x40)), iVar3 != 0)
       ) goto LAB_00121dce;
    uVar12 = uVar12 + (long)(int)sVar6;
  }
  if ((0 < iVar13) && ((*(byte *)((long)arg + 0x48) & 2) != 0)) {
    uVar12 = local_70;
  }
  goto LAB_00121aa4;
}

Assistant:

static void *
sndio_mainloop(void *arg)
{
  struct pollfd *pfds;
  cubeb_stream *s = arg;
  int n, eof = 0, prime, nfds, events, revents, state = CUBEB_STATE_STARTED;
  size_t pstart = 0, pend = 0, rstart = 0, rend = 0;
  long nfr;

  nfds = WRAP(sio_nfds)(s->hdl);
  pfds = calloc(nfds, sizeof (struct pollfd));
  if (pfds == NULL)
	  return NULL;

  DPR("sndio_mainloop()\n");
  s->state_cb(s, s->arg, CUBEB_STATE_STARTED);
  pthread_mutex_lock(&s->mtx);
  if (!WRAP(sio_start)(s->hdl)) {
    pthread_mutex_unlock(&s->mtx);
    free(pfds);
    return NULL;
  }
  DPR("sndio_mainloop(), started\n");

  if (s->mode & SIO_PLAY) {
    pstart = pend = s->nfr * s->pbpf;
    prime = s->nblks;
    if (s->mode & SIO_REC) {
      memset(s->rbuf, 0, s->nfr * s->rbpf);
      rstart = rend = s->nfr * s->rbpf;
    }
  } else {
    prime = 0;
    rstart = 0;
    rend = s->nfr * s->rbpf;
  }

  for (;;) {
    if (!s->active) {
      DPR("sndio_mainloop() stopped\n");
      state = CUBEB_STATE_STOPPED;
      break;
    }

    /* do we have a complete block? */
    if ((!(s->mode & SIO_PLAY) || pstart == pend) &&
	(!(s->mode & SIO_REC) || rstart == rend)) {

      if (eof) {
        DPR("sndio_mainloop() drained\n");
        state = CUBEB_STATE_DRAINED;
        break;
      }

      if ((s->mode & SIO_REC) && s->conv)
        s16_to_float(s->rbuf, s->nfr * s->rchan);

      /* invoke call-back, it returns less that s->nfr if done */
      pthread_mutex_unlock(&s->mtx);
      nfr = s->data_cb(s, s->arg, s->rbuf, s->pbuf, s->nfr);
      pthread_mutex_lock(&s->mtx);
      if (nfr < 0) {
        DPR("sndio_mainloop() cb err\n");
        state = CUBEB_STATE_ERROR;
        break;
      }
      s->swpos += nfr;

      /* was this last call-back invocation (aka end-of-stream) ? */
      if (nfr < s->nfr) {

        if (!(s->mode & SIO_PLAY) || nfr == 0) {
          state = CUBEB_STATE_DRAINED;
          break;
	}

        /* need to write (aka drain) the partial play block we got */
        pend = nfr * s->pbpf;
        eof = 1;
      }

      if (prime > 0)
        prime--;

      if (s->mode & SIO_PLAY) {
        if (s->conv)
          float_to_s16(s->pbuf, nfr * s->pchan, s->volume);
        else
          s16_setvol(s->pbuf, nfr * s->pchan, s->volume);
      }

      if (s->mode & SIO_REC)
        rstart = 0;
      if (s->mode & SIO_PLAY)
        pstart = 0;
    }

    events = 0;
    if ((s->mode & SIO_REC) && rstart < rend && prime == 0)
      events |= POLLIN;
    if ((s->mode & SIO_PLAY) && pstart < pend)
      events |= POLLOUT;
    nfds = WRAP(sio_pollfd)(s->hdl, pfds, events);

    if (nfds > 0) {
      pthread_mutex_unlock(&s->mtx);
      n = poll(pfds, nfds, -1);
      pthread_mutex_lock(&s->mtx);
      if (n < 0)
        continue;
    }

    revents = WRAP(sio_revents)(s->hdl, pfds);

    if (revents & POLLHUP) {
      state = CUBEB_STATE_ERROR;
      break;
    }

    if (revents & POLLOUT) {
      n = WRAP(sio_write)(s->hdl, s->pbuf + pstart, pend - pstart);
      if (n == 0 && WRAP(sio_eof)(s->hdl)) {
        DPR("sndio_mainloop() werr\n");
        state = CUBEB_STATE_ERROR;
        break;
      }
      pstart += n;
    }

    if (revents & POLLIN) {
      n = WRAP(sio_read)(s->hdl, s->rbuf + rstart, rend - rstart);
      if (n == 0 && WRAP(sio_eof)(s->hdl)) {
        DPR("sndio_mainloop() rerr\n");
        state = CUBEB_STATE_ERROR;
        break;
      }
      rstart += n;
    }

    /* skip rec block, if not recording (yet) */
    if (prime > 0 && (s->mode & SIO_REC))
      rstart = rend;
  }
  WRAP(sio_stop)(s->hdl);
  s->hwpos = s->swpos;
  pthread_mutex_unlock(&s->mtx);
  s->state_cb(s, s->arg, state);
  free(pfds);
  return NULL;
}